

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::load_from_image(CVmObjDict *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  vm_dict_ext *pvVar1;
  size_t in_RCX;
  char *in_RDX;
  CVmObjDict *in_RDI;
  CVmObjTable *unaff_retaddr;
  CVmObjDict *in_stack_00000150;
  CVmObjDict *pCVar2;
  vm_obj_id_t obj;
  
  pCVar2 = in_RDI;
  pvVar1 = get_ext(in_RDI);
  obj = (vm_obj_id_t)((ulong)pCVar2 >> 0x20);
  pvVar1->image_data_ = in_RDX;
  pvVar1 = get_ext(in_RDI);
  pvVar1->image_data_size_ = in_RCX;
  build_hash_from_image(in_stack_00000150);
  CVmObjTable::request_post_load_init(unaff_retaddr,obj);
  return;
}

Assistant:

void CVmObjDict::load_from_image(VMG_ vm_obj_id_t self,
                                 const char *ptr, size_t siz)
{
    /* remember where our image data comes from */
    get_ext()->image_data_ = ptr;
    get_ext()->image_data_size_ = siz;

    /* build the hash table from the image data */
    build_hash_from_image(vmg0_);

    /* 
     *   register for post-load initialization, as we might need to rebuild
     *   our hash table once we have access to the comparator object 
     */
    G_obj_table->request_post_load_init(self);
}